

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::DefaultPrintTo<std::array<int,10ul>>
               (array<int,_10UL> *param_1,ostream *param_2)

{
  const_iterator pvVar1;
  int *local_38;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  array<int,_10UL> *container_local;
  
  std::operator<<(param_2,'{');
  it = (const_iterator)0x0;
  local_38 = std::array<int,_10UL>::begin(param_1);
  do {
    pvVar1 = std::array<int,_10UL>::end(param_1);
    if (local_38 == pvVar1) {
LAB_00120770:
      if (it != (const_iterator)0x0) {
        std::operator<<(param_2,' ');
      }
      std::operator<<(param_2,'}');
      return;
    }
    if ((it != (const_iterator)0x0) && (std::operator<<(param_2,','), it == (const_iterator)0x20)) {
      std::operator<<(param_2," ...");
      goto LAB_00120770;
    }
    std::operator<<(param_2,' ');
    UniversalPrint<int>(local_38,param_2);
    local_38 = local_38 + 1;
    it = (const_iterator)((long)it + 1);
  } while( true );
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}